

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O2

bool bssl::ssl_add_message_cbb(SSL *ssl,CBB *cbb)

{
  _func_bool_SSL_ptr_Array<unsigned_char> *p_Var1;
  bool bVar2;
  size_t extraout_RDX;
  Array<unsigned_char> AVar3;
  Array<unsigned_char> msg;
  Array<unsigned_char> local_38;
  Array<unsigned_char> local_20;
  
  local_38.data_ = (uchar *)0x0;
  local_38.size_ = 0;
  bVar2 = (*ssl->method->finish_message)(ssl,cbb,&local_38);
  if (bVar2) {
    p_Var1 = ssl->method->add_message;
    Array<unsigned_char>::Array(&local_20,&local_38);
    AVar3.size_ = extraout_RDX;
    AVar3.data_ = (uchar *)&local_20;
    bVar2 = (*p_Var1)(ssl,AVar3);
    Array<unsigned_char>::~Array(&local_20);
  }
  else {
    bVar2 = false;
  }
  Array<unsigned_char>::~Array(&local_38);
  return bVar2;
}

Assistant:

bool ssl_add_message_cbb(SSL *ssl, CBB *cbb) {
  Array<uint8_t> msg;
  if (!ssl->method->finish_message(ssl, cbb, &msg) ||
      !ssl->method->add_message(ssl, std::move(msg))) {
    return false;
  }

  return true;
}